

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int.hpp
# Opt level: O3

int msgpack::v1::type::detail::convert_integer_sign<int,_true>::convert(object *o)

{
  object_type oVar1;
  undefined8 *puVar2;
  ulong uVar3;
  
  oVar1 = (o->super_object).type;
  if (oVar1 == NEGATIVE_INTEGER) {
    uVar3 = (o->super_object).via.i64;
    if (-0x80000001 < (long)uVar3) goto LAB_0014d770;
  }
  else if ((oVar1 == POSITIVE_INTEGER) &&
          (uVar3 = (o->super_object).via.i64, (uVar3 & 0xffffffff80000000) == 0)) {
LAB_0014d770:
    return (int)uVar3;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_001649f8;
  __cxa_throw(puVar2,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

static T convert(msgpack::object const& o) {
        if(o.type == msgpack::type::POSITIVE_INTEGER) {
            if(o.via.u64 > static_cast<uint64_t>(std::numeric_limits<T>::max()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.u64);
        } else if(o.type == msgpack::type::NEGATIVE_INTEGER) {
            if(o.via.i64 < static_cast<int64_t>(std::numeric_limits<T>::min()))
            { throw msgpack::type_error(); }
            return static_cast<T>(o.via.i64);
        }
        throw msgpack::type_error();
    }